

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

int Kit_TruthCountOnes(uint *pIn,int nVars)

{
  int iVar1;
  int local_1c;
  int local_18;
  int Counter;
  int w;
  int nVars_local;
  uint *pIn_local;
  
  local_1c = 0;
  local_18 = Kit_TruthWordNum(nVars);
  while (local_18 = local_18 + -1, -1 < local_18) {
    iVar1 = Kit_WordCountOnes(pIn[local_18]);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

static inline int Kit_TruthCountOnes( unsigned * pIn, int nVars )
{
    int w, Counter = 0;
    for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
        Counter += Kit_WordCountOnes(pIn[w]);
    return Counter;
}